

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Clasp::Asp::LogicProgram::Min*>(Min **first,Min **last,Min **x)

{
  Min *pMVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pMVar1 = *x;
      *first = pMVar1;
      first = first + 1;
LAB_00142557:
      *first = pMVar1;
      first = first + 1;
switchD_00142532_caseD_6:
      pMVar1 = *x;
      *first = pMVar1;
      first = first + 1;
LAB_00142568:
      *first = pMVar1;
      first = first + 1;
switchD_00142532_caseD_4:
      pMVar1 = *x;
      *first = pMVar1;
      first = first + 1;
LAB_00142579:
      *first = pMVar1;
      first = first + 1;
switchD_00142532_caseD_2:
      pMVar1 = *x;
      *first = pMVar1;
      first = first + 1;
LAB_0014258a:
      *first = pMVar1;
    }
    break;
  case 1:
    pMVar1 = *x;
    goto LAB_0014258a;
  case 2:
    goto switchD_00142532_caseD_2;
  case 3:
    pMVar1 = *x;
    goto LAB_00142579;
  case 4:
    goto switchD_00142532_caseD_4;
  case 5:
    pMVar1 = *x;
    goto LAB_00142568;
  case 6:
    goto switchD_00142532_caseD_6;
  case 7:
    pMVar1 = *x;
    goto LAB_00142557;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}